

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_b10_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 in_XMM0 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  
  auVar3 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    auVar4 = pmovzxbw(ZEXT416(*(uint *)mask),ZEXT416(*(uint *)mask));
    uVar1 = *(undefined8 *)src0;
    uVar2 = *(undefined8 *)src1;
    uVar5 = pavgw((ushort)((short)uVar1 * auVar4._0_2_ +
                          (short)uVar2 * (auVar3._0_2_ - auVar4._0_2_)) >> 5,0);
    uVar6 = pavgw((ushort)((short)((ulong)uVar1 >> 0x10) * auVar4._2_2_ +
                          (short)((ulong)uVar2 >> 0x10) * (auVar3._2_2_ - auVar4._2_2_)) >> 5,0);
    uVar7 = pavgw((ushort)((short)((ulong)uVar1 >> 0x20) * auVar4._4_2_ +
                          (short)((ulong)uVar2 >> 0x20) * (auVar3._4_2_ - auVar4._4_2_)) >> 5,0);
    uVar8 = pavgw((ushort)((short)((ulong)uVar1 >> 0x30) * auVar4._6_2_ +
                          (short)((ulong)uVar2 >> 0x30) * (auVar3._6_2_ - auVar4._6_2_)) >> 5,0);
    pavgw(0,0);
    pavgw(0,0);
    pavgw(0,0);
    pavgw(0,0);
    *(ulong *)dst = CONCAT26(uVar8,CONCAT24(uVar7,CONCAT22(uVar6,uVar5)));
    mask = (uint8_t *)((long)mask + (ulong)mask_stride);
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    dst = dst + dst_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b10_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;
  blend_a64_mask_bn_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                              src1_stride, mask, mask_stride, h, blend_4_b10);
}